

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

int UseHealthItems(TArray<AInventory_*,_AInventory_*> *Items,int *saveHealth)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  AInventory **ppAVar5;
  int local_30;
  int i_1;
  int count;
  uint i;
  int index;
  int maxhealth;
  int saved;
  int *saveHealth_local;
  TArray<AInventory_*,_AInventory_*> *Items_local;
  
  index = 0;
  do {
    uVar3 = TArray<AInventory_*,_AInventory_*>::Size(Items);
    bVar2 = false;
    if (uVar3 != 0) {
      bVar2 = 0 < *saveHealth;
    }
    if (!bVar2) {
      return index;
    }
    i = 0;
    count = -1;
    for (i_1 = 0; uVar3 = TArray<AInventory_*,_AInventory_*>::Size(Items), (uint)i_1 < uVar3;
        i_1 = i_1 + 1) {
      ppAVar5 = TArray<AInventory_*,_AInventory_*>::operator[](Items,(ulong)(uint)i_1);
      if ((int)i < ((*ppAVar5)->super_AActor).health) {
        count = i_1;
        ppAVar5 = TArray<AInventory_*,_AInventory_*>::operator[](Items,(ulong)(uint)i_1);
        i = ((*ppAVar5)->super_AActor).health;
      }
    }
    iVar1 = *saveHealth;
    for (local_30 = 0; local_30 < (int)(iVar1 + i + -1) / (int)i; local_30 = local_30 + 1) {
      index = i + index;
      *saveHealth = *saveHealth - i;
      ppAVar5 = TArray<AInventory_*,_AInventory_*>::operator[](Items,(long)count);
      iVar4 = (*ppAVar5)->Amount + -1;
      (*ppAVar5)->Amount = iVar4;
      if (iVar4 == 0) {
        ppAVar5 = TArray<AInventory_*,_AInventory_*>::operator[](Items,(long)count);
        (*((*ppAVar5)->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
        TArray<AInventory_*,_AInventory_*>::Delete(Items,count);
        break;
      }
    }
  } while( true );
}

Assistant:

static int UseHealthItems(TArray<AInventory *> &Items, int &saveHealth)
{
	int saved = 0;

	while (Items.Size() > 0 && saveHealth > 0)
	{
		int maxhealth = 0;
		int index = -1;

		// Find the largest item in the list
		for(unsigned i = 0; i < Items.Size(); i++)
		{
			if (Items[i]->health > maxhealth)
			{
				index = i;
				maxhealth = Items[i]->health;
			}
		}

		// Now apply the health items, using the same logic as Heretic and Hexen.
		int count = (saveHealth + maxhealth-1) / maxhealth;
		for(int i = 0; i < count; i++)
		{
			saved += maxhealth;
			saveHealth -= maxhealth;
			if (--Items[index]->Amount == 0)
			{
				Items[index]->DepleteOrDestroy ();
				Items.Delete(index);
				break;
			}
		}
	}
	return saved;
}